

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derOIDDec(char *oid,size_t *len,octet *der,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  uint val;
  u32 val_00;
  char *pcVar5;
  size_t sVar6;
  size_t l;
  u32 t;
  int local_54;
  size_t local_50;
  u32 local_44;
  size_t *local_40;
  size_t local_38;
  
  sVar1 = derTLDec(&local_44,&local_50,der,count);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    uVar3 = local_50 + sVar1;
    sVar6 = 0;
    if (uVar3 <= count) {
      sVar6 = sVar1;
    }
    sVar1 = 0xffffffffffffffff;
    if (uVar3 <= count) {
      sVar1 = uVar3;
    }
    der = der + sVar6;
  }
  if (local_44 == 6 && sVar1 != 0xffffffffffffffff) {
    local_38 = local_50;
    local_40 = len;
    if (local_50 == 0) {
      sVar6 = 0;
    }
    else {
      local_54 = 3;
      sVar6 = 0;
      sVar4 = 0;
      val = 0;
      do {
        if (0x1ffffff < val) goto LAB_00111d8e;
        val = der[sVar4] & 0x7f | val << 7;
        if (-1 < (char)der[sVar4]) {
          if (local_54 == 3) {
            local_54 = 0;
            if (val < 0x28) {
              val_00 = 0;
            }
            else if (val < 0x50) {
              val = val - 0x28;
              val_00 = 1;
            }
            else {
              val = val - 0x50;
              val_00 = 2;
            }
            pcVar5 = oid + sVar6;
            if (oid == (char *)0x0) {
              pcVar5 = (char *)0x0;
            }
            sVar2 = derSIDDec(pcVar5,val_00);
            sVar6 = sVar6 + sVar2;
          }
          if (oid != (char *)0x0) {
            oid[sVar6] = '.';
          }
          pcVar5 = oid + sVar6 + 1;
          if (oid == (char *)0x0) {
            pcVar5 = (char *)0x0;
          }
          sVar2 = derSIDDec(pcVar5,val);
          sVar6 = sVar6 + sVar2 + 1;
          val = 0;
        }
        sVar4 = sVar4 + 1;
      } while (local_38 != sVar4);
    }
    if (oid != (char *)0x0) {
      oid[sVar6] = '\0';
    }
    if (local_40 != (size_t *)0x0) {
      *local_40 = sVar6;
    }
  }
  else {
LAB_00111d8e:
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

size_t derOIDDec(char* oid, size_t* len, const octet der[], size_t count)
{
	u32 d1 = 3;
	u32 val = 0;
	size_t l, pos, oid_len;
	// pre
	ASSERT(memIsValid(der, count));
	// проверить тег и определить значение
	count = derDec2(&der, &l, der, count, 0x06);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// обработать sid
	for (pos = oid_len = 0; pos < l; ++pos)
	{
		// переполнение?
		if (val & 0xFE000000)
			return SIZE_MAX;
		// лидирующий 0?
		if (val == 0 && der[pos] == 128)
			return SIZE_MAX;
		// обработать октет sid
		val <<= 7, val |= (size_t)der[pos] & 127;
		// последний октет sid?
		if ((der[pos] & 128) == 0)
		{
			// первый sid?
			if (d1 == 3)
			{
				if (val < 40)
					d1 = 0;
				else if (val < 80)
					d1 = 1, val -= 40;
				else
					d1 = 2, val -= 80;
				oid_len += derSIDDec(oid ? oid + oid_len : oid, d1);
				d1 = 0;
			}
			// добавить ".val"
			oid ? oid[oid_len++] = '.' : oid_len++;
			oid_len += derSIDDec(oid ? oid + oid_len : oid, val);
			// к следующему sid
			val = 0;
		}
	}
	// очистка и выход
	d1 = val = 0, pos = l = 0;
	oid ? oid[oid_len] = '\0' : oid_len;
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		ASSERT(oid == 0 || memIsDisjoint2(len, O_PER_S, oid, strLen(oid)));
		*len = oid_len;
	}
	return count;
}